

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeptData.h
# Opt level: O3

vector<double,_std::allocator<double>_> * __thiscall
PeptData::SegmentsMass
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,PeptData *this,
          char *sequence,size_t sequence_length,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *cleavage_sites)

{
  iterator __position;
  pointer pdVar1;
  pointer puVar2;
  const_iterator cVar3;
  undefined8 uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  size_t sVar9;
  double segment;
  out_of_range e;
  double local_60;
  code *local_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_50;
  size_t local_48;
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar2 = (cleavage_sites->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
           .super__Vector_impl_data._M_start;
  lVar5 = (long)(cleavage_sites->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
  if (lVar5 != 0) {
    uVar6 = lVar5 >> 2;
    uVar7 = 0;
    local_58 = std::ios::widen;
    local_50 = cleavage_sites;
    local_48 = sequence_length;
    do {
      sVar9 = local_48;
      if (uVar6 - 1 != uVar7) {
        sVar9 = (size_t)puVar2[(int)uVar7 + 1];
      }
      uVar8 = puVar2[uVar7];
      local_60 = 0.0;
      while (uVar6 = (ulong)uVar8, uVar6 < sVar9) {
        uVar8 = uVar8 + 1;
        cVar3 = std::
                _Hashtable<char,_std::pair<const_char,_double>,_std::allocator<std::pair<const_char,_double>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&(this->mass_table_)._M_h,sequence + uVar6);
        if (cVar3.super__Node_iterator_base<std::pair<const_char,_double>,_false>._M_cur ==
            (__node_type *)0x0) {
          uVar4 = std::__throw_out_of_range("_Map_base::at");
          pdVar1 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          if (pdVar1 != (pointer)0x0) {
            operator_delete(pdVar1,(long)(__return_storage_ptr__->
                                         super__Vector_base<double,_std::allocator<double>_>).
                                         _M_impl.super__Vector_impl_data._M_end_of_storage -
                                   (long)pdVar1);
          }
          _Unwind_Resume(uVar4);
        }
        local_60 = *(double *)
                    ((long)cVar3.super__Node_iterator_base<std::pair<const_char,_double>,_false>.
                           _M_cur + 0x10) + local_60;
      }
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)__return_storage_ptr__,__position,
                   &local_60);
      }
      else {
        *__position._M_current = local_60;
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      uVar7 = (ulong)((int)uVar7 + 1);
      puVar2 = (local_50->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar6 = (long)(local_50->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 2;
    } while (uVar7 < uVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> SegmentsMass(const char* sequence, size_t sequence_length,
                                     const std::vector<unsigned>& cleavage_sites) const {
        std::vector<double> segments_mass;
        for (unsigned i = 0; i < cleavage_sites.size(); ++i) {
            auto start = cleavage_sites[i];
            auto end = i == cleavage_sites.size() - 1
                       ? sequence_length
                       : cleavage_sites[i + 1];
            double segment = 0;
            try {
                for (auto j = start; j < end; ++j) {
                    segment += mass_table_.at(sequence[j]);  // will throw an exception if no such character in table
                }
            }
            catch (std::out_of_range e) {
                segment = 0;  // if there is an error, the segment equals to 0
            }
            segments_mass.push_back(segment);
        }
        return segments_mass;
    }